

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::InstanceConfigRuleSyntax::setChild
          (InstanceConfigRuleSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00471dd8 + *(int *)(&DAT_00471dd8 + in_RSI * 4)))();
  return;
}

Assistant:

void InstanceConfigRuleSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: instance = child.token(); return;
        case 1: topModule = child.token(); return;
        case 2: instanceNames = child.node()->as<SyntaxList<ConfigInstanceIdentifierSyntax>>(); return;
        case 3: ruleClause = child.node() ? &child.node()->as<ConfigRuleClauseSyntax>() : nullptr; return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}